

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::reduceedgesatvertex(tetgenmesh *this,point startpt,arraypool *endptlist)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  interresult iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  triface searchtet;
  triface local_c0;
  point local_b0;
  flipconstraints local_a8;
  
  local_c0.tet = (tetrahedron *)0x0;
  local_c0.ver = 0;
  local_a8.seg[0] = (point)0x0;
  local_a8.fac[0] = (point)0x0;
  local_a8.enqflag = 0;
  local_a8.chkencflag = 0;
  local_a8.unflip = 0;
  local_a8.collectnewtets = 0;
  local_a8.collectencsegflag = 0;
  local_a8.remove_ndelaunay_edge = 0;
  local_a8.bak_tetprism_vol._0_4_ = 0;
  local_a8.bak_tetprism_vol._4_4_ = 0;
  local_a8.tetprism_vol_sum._0_4_ = 0;
  local_a8._36_8_ = 0;
  local_a8.cosdihed_in = 0.0;
  local_a8.cosdihed_out = 0.0;
  local_a8.checkflipeligibility = 1;
  iVar6 = 0;
  uVar8 = 0;
  local_b0 = startpt;
  local_a8.remvert = startpt;
  do {
    while (endptlist->objects <= (long)(int)uVar8) {
      uVar8 = 0;
      bVar9 = iVar6 == 0;
      iVar6 = 0;
      if (bVar9) {
        return (int)endptlist->objects;
      }
    }
    pcVar1 = endptlist->toparray[(int)uVar8 >> ((byte)endptlist->log2objectsperblock & 0x1f)];
    lVar7 = (long)endptlist->objectbytes * (long)(int)(endptlist->objectsperblockmark & uVar8);
    if (*(point *)(pcVar1 + lVar7) != this->dummypoint) {
      if (this->nonconvex == 0) {
        point2tetorg(this,local_b0,&local_c0);
        iVar4 = finddirection(this,&local_c0,*(point *)(pcVar1 + lVar7));
        if (iVar4 == ACROSSVERT) goto LAB_0013210b;
      }
      else {
        iVar3 = getedge(this,local_b0,*(point *)(pcVar1 + lVar7),&local_c0);
        if (iVar3 != 0) {
LAB_0013210b:
          if ((local_c0.tet[destpivot[local_c0.ver]] != *(tetrahedron *)(pcVar1 + lVar7)) ||
             (((local_c0.tet[8] != (tetrahedron)0x0 &&
               (local_c0.tet[8][ver2edge[local_c0.ver]] != (double *)0x0)) ||
              (iVar3 = removeedgebyflips(this,&local_c0,&local_a8), iVar3 != 2))))
          goto LAB_00132198;
        }
      }
      iVar6 = iVar6 + 1;
      lVar2 = endptlist->objects;
      uVar5 = (int)lVar2 - 1;
      *(undefined8 *)(pcVar1 + lVar7) =
           *(undefined8 *)
            (endptlist->toparray[(int)uVar5 >> ((byte)endptlist->log2objectsperblock & 0x1f)] +
            (long)endptlist->objectbytes * (long)(int)(uVar5 & endptlist->objectsperblockmark));
      endptlist->objects = lVar2 + -1;
      uVar8 = uVar8 - 1;
    }
LAB_00132198:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int tetgenmesh::reduceedgesatvertex(point startpt, arraypool* endptlist)
{
  triface searchtet;
  point *pendpt, *parypt;
  enum interresult dir;
  flipconstraints fc;
  int reduceflag;
  int count;
  int n, i, j;


  fc.remvert = startpt;
  fc.checkflipeligibility = 1;

  while (1) {

    count = 0;

    for (i = 0; i < endptlist->objects; i++) {
      pendpt = (point *) fastlookup(endptlist, i);
      if (*pendpt == dummypoint) {
        continue; // Do not reduce a virtual edge.
      }
      reduceflag = 0;
      // Find the edge.
      if (nonconvex) {
        if (getedge(startpt, *pendpt, &searchtet)) {
          dir = ACROSSVERT;
        } else {
          // The edge does not exist (was flipped).
          dir = INTERSECT;
        }
      } else {
        point2tetorg(startpt, searchtet);
        dir = finddirection(&searchtet, *pendpt);
      }
      if (dir == ACROSSVERT) {
        if (dest(searchtet) == *pendpt) {
          // Do not flip a segment.
          if (!issubseg(searchtet)) {
            n = removeedgebyflips(&searchtet, &fc);
            if (n == 2) {
              reduceflag = 1;
            }
          }
        }
      } else {
        // The edge has been flipped.
        reduceflag = 1;
      }
      if (reduceflag) {
        count++;
        // Move the last vertex into this slot.
        j = endptlist->objects - 1;
        parypt = (point *) fastlookup(endptlist, j);
        *pendpt = *parypt;
        endptlist->objects--;
        i--;
      }
    } // i

    if (count == 0) {
      // No edge is reduced.
      break;
    }

  } // while (1)

  return (int) endptlist->objects;
}